

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

int cmSystemTools::WaitForLine
              (cmsysProcess *process,string *line,cmDuration timeout,
              vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  bool bVar1;
  reference pcVar2;
  ulong uVar3;
  char *pcVar4;
  bool local_279;
  bool local_259;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_250;
  const_iterator local_248;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_240;
  const_iterator local_238;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_230;
  char *local_228;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_220;
  const_iterator local_218;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_210;
  const_iterator local_208;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_200;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1f8;
  char *local_1f0;
  size_type local_1e8;
  size_type size_3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1c0;
  char *local_1b8;
  size_type local_1b0;
  size_type size_2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_188;
  char *local_180;
  size_type local_178;
  size_type size_1;
  char *local_168;
  size_type local_160;
  size_type size;
  rep rStack_150;
  int pipe;
  double timeoutAsDbl;
  char *data;
  iterator iStack_138;
  int length;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_130;
  const_iterator local_128;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_120;
  const_iterator local_118;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_110;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_108;
  ulong local_100;
  size_type length_2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_f0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_e8;
  undefined4 local_dc;
  char *local_d8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_d0;
  const_iterator local_c8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_c0;
  const_iterator local_b8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_a0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_98;
  ulong local_90;
  size_type length_1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_80;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_78;
  undefined1 local_70 [8];
  string strdata;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Stack_48;
  cmProcessOutput processOutput;
  iterator erriter;
  iterator outiter;
  vector<char,_std::allocator<char>_> *err_local;
  vector<char,_std::allocator<char>_> *out_local;
  string *line_local;
  cmsysProcess *process_local;
  cmDuration timeout_local;
  
  process_local = (cmsysProcess *)timeout.__r;
  std::__cxx11::string::clear();
  erriter = std::vector<char,_std::allocator<char>_>::begin(out);
  _Stack_48._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
  cmProcessOutput::cmProcessOutput
            ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),Auto,0x400);
  std::__cxx11::string::string((string *)local_70);
LAB_0011d963:
  do {
    local_78._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(out);
    bVar1 = __gnu_cxx::operator!=(&erriter,&local_78);
    if (bVar1) {
      pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&erriter);
      local_259 = false;
      if (*pcVar2 == '\r') {
        local_80 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator+(&erriter,1);
        length_1 = (size_type)std::vector<char,_std::allocator<char>_>::end(out);
        local_259 = __gnu_cxx::operator==
                              (&local_80,
                               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                *)&length_1);
      }
      if (local_259 == false) {
        pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&erriter);
        if ((*pcVar2 == '\n') ||
           (pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator*(&erriter), *pcVar2 == '\0')) {
          local_98._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
          local_90 = __gnu_cxx::operator-(&erriter,&local_98);
          bVar1 = false;
          if (1 < local_90) {
            local_a0 = __gnu_cxx::
                       __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator-(&erriter,1);
            pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator*(&local_a0);
            bVar1 = *pcVar2 == '\r';
          }
          if (bVar1) {
            local_90 = local_90 - 1;
          }
          if (local_90 != 0) {
            pcVar4 = std::vector<char,_std::allocator<char>_>::data(out);
            std::__cxx11::string::append((char *)line,(ulong)pcVar4);
          }
          local_c0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_b8,&local_c0);
          local_d0 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator+(&erriter,1);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_c8,&local_d0);
          local_d8 = (char *)std::vector<char,_std::allocator<char>_>::erase(out,local_b8,local_c8);
          timeout_local.__r._4_4_ = 2;
          goto LAB_0011e2c1;
        }
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                  (&erriter);
        goto LAB_0011d963;
      }
    }
    while( true ) {
      local_e8._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(err);
      bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffb8,&local_e8);
      if (!bVar1) break;
      pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&stack0xffffffffffffffb8);
      local_279 = false;
      if (*pcVar2 == '\r') {
        local_f0 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator+(&stack0xffffffffffffffb8,1);
        length_2 = (size_type)std::vector<char,_std::allocator<char>_>::end(err);
        local_279 = __gnu_cxx::operator==
                              (&local_f0,
                               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                *)&length_2);
      }
      if (local_279 != false) break;
      pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&stack0xffffffffffffffb8);
      if ((*pcVar2 == '\n') ||
         (pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&stack0xffffffffffffffb8), *pcVar2 == '\0')) {
        local_108._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
        local_100 = __gnu_cxx::operator-(&stack0xffffffffffffffb8,&local_108);
        bVar1 = false;
        if (1 < local_100) {
          local_110 = __gnu_cxx::
                      __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                      operator-(&stack0xffffffffffffffb8,1);
          pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&local_110);
          bVar1 = *pcVar2 == '\r';
        }
        if (bVar1) {
          local_100 = local_100 - 1;
        }
        if (local_100 != 0) {
          pcVar4 = std::vector<char,_std::allocator<char>_>::data(err);
          std::__cxx11::string::append((char *)line,(ulong)pcVar4);
        }
        local_120._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_118,&local_120);
        local_130 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                    ::operator+(&stack0xffffffffffffffb8,1);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_128,&local_130);
        iStack_138 = std::vector<char,_std::allocator<char>_>::erase(err,local_118,local_128);
        timeout_local.__r._4_4_ = 3;
        goto LAB_0011e2c1;
      }
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                (&stack0xffffffffffffffb8);
    }
    rStack_150 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                           ((duration<double,_std::ratio<1L,_1L>_> *)&process_local);
    size._4_4_ = cmsysProcess_WaitForData
                           (process,(char **)&timeoutAsDbl,(int *)((long)&data + 4),
                            &stack0xfffffffffffffeb0);
    if (size._4_4_ == 0xff) {
      timeout_local.__r._4_4_ = 0xff;
      goto LAB_0011e2c1;
    }
    if (size._4_4_ == 2) {
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),(char *)timeoutAsDbl,
                 (long)data._4_4_,(string *)local_70,1);
      local_160 = std::vector<char,_std::allocator<char>_>::size(out);
      cm::
      append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (out,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      size_1 = (size_type)std::vector<char,_std::allocator<char>_>::begin(out);
      local_168 = (char *)__gnu_cxx::
                          __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                          operator+((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                     *)&size_1,local_160);
      erriter._M_current = local_168;
    }
    else if (size._4_4_ == 3) {
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),(char *)timeoutAsDbl,
                 (long)data._4_4_,(string *)local_70,2);
      local_178 = std::vector<char,_std::allocator<char>_>::size(err);
      cm::
      append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      local_188._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
      local_180 = (char *)__gnu_cxx::
                          __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                          operator+(&local_188,local_178);
      _Stack_48 = (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_180;
    }
    else if (size._4_4_ == 0) {
      std::__cxx11::string::string((string *)&size_2);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),(string *)&size_2,
                 (string *)local_70,1);
      std::__cxx11::string::~string((string *)&size_2);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        local_1b0 = std::vector<char,_std::allocator<char>_>::size(out);
        cm::
        append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (out,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                  );
        local_1c0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
        local_1b8 = (char *)__gnu_cxx::
                            __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                            operator+(&local_1c0,local_1b0);
        erriter._M_current = local_1b8;
      }
      std::__cxx11::string::string((string *)&size_3);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),(string *)&size_3,
                 (string *)local_70,2);
      std::__cxx11::string::~string((string *)&size_3);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        local_1e8 = std::vector<char,_std::allocator<char>_>::size(err);
        cm::
        append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                  );
        local_1f8._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
        local_1f0 = (char *)__gnu_cxx::
                            __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                            operator+(&local_1f8,local_1e8);
        _Stack_48 = (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_1f0;
      }
      bVar1 = std::vector<char,_std::allocator<char>_>::empty(out);
      if (bVar1) {
        bVar1 = std::vector<char,_std::allocator<char>_>::empty(err);
        if (bVar1) {
          timeout_local.__r._4_4_ = 0;
        }
        else {
          pcVar4 = std::vector<char,_std::allocator<char>_>::data(err);
          local_230._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
          __gnu_cxx::operator-(&stack0xffffffffffffffb8,&local_230);
          std::__cxx11::string::append((char *)line,(ulong)pcVar4);
          local_240._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_238,&local_240);
          local_250._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(err);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_248,&local_250);
          std::vector<char,_std::allocator<char>_>::erase(err,local_238,local_248);
          timeout_local.__r._4_4_ = 3;
        }
      }
      else {
        pcVar4 = std::vector<char,_std::allocator<char>_>::data(out);
        local_200._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
        __gnu_cxx::operator-(&erriter,&local_200);
        std::__cxx11::string::append((char *)line,(ulong)pcVar4);
        local_210._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_208,&local_210);
        local_220._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(out);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_218,&local_220);
        local_228 = (char *)std::vector<char,_std::allocator<char>_>::erase(out,local_208,local_218)
        ;
        timeout_local.__r._4_4_ = 2;
      }
LAB_0011e2c1:
      local_dc = 1;
      std::__cxx11::string::~string((string *)local_70);
      return timeout_local.__r._4_4_;
    }
  } while( true );
}

Assistant:

int cmSystemTools::WaitForLine(cmsysProcess* process, std::string& line,
                               cmDuration timeout, std::vector<char>& out,
                               std::vector<char>& err)
{
  line.clear();
  auto outiter = out.begin();
  auto erriter = err.begin();
  cmProcessOutput processOutput;
  std::string strdata;
  while (true) {
    // Check for a newline in stdout.
    for (; outiter != out.end(); ++outiter) {
      if ((*outiter == '\r') && ((outiter + 1) == out.end())) {
        break;
      }
      if (*outiter == '\n' || *outiter == '\0') {
        std::vector<char>::size_type length = outiter - out.begin();
        if (length > 1 && *(outiter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(out.data(), length);
        }
        out.erase(out.begin(), outiter + 1);
        return cmsysProcess_Pipe_STDOUT;
      }
    }

    // Check for a newline in stderr.
    for (; erriter != err.end(); ++erriter) {
      if ((*erriter == '\r') && ((erriter + 1) == err.end())) {
        break;
      }
      if (*erriter == '\n' || *erriter == '\0') {
        std::vector<char>::size_type length = erriter - err.begin();
        if (length > 1 && *(erriter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(err.data(), length);
        }
        err.erase(err.begin(), erriter + 1);
        return cmsysProcess_Pipe_STDERR;
      }
    }

    // No newlines found.  Wait for more data from the process.
    int length;
    char* data;
    double timeoutAsDbl = timeout.count();
    int pipe =
      cmsysProcess_WaitForData(process, &data, &length, &timeoutAsDbl);
    if (pipe == cmsysProcess_Pipe_Timeout) {
      // Timeout has been exceeded.
      return pipe;
    }
    if (pipe == cmsysProcess_Pipe_STDOUT) {
      processOutput.DecodeText(data, length, strdata, 1);
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      cm::append(out, strdata);
      outiter = out.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 2);
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      cm::append(err, strdata);
      erriter = err.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_None) {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = out.size();
        cm::append(out, strdata);
        outiter = out.begin() + size;
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = err.size();
        cm::append(err, strdata);
        erriter = err.begin() + size;
      }
      if (!out.empty()) {
        line.append(out.data(), outiter - out.begin());
        out.erase(out.begin(), out.end());
        return cmsysProcess_Pipe_STDOUT;
      }
      if (!err.empty()) {
        line.append(err.data(), erriter - err.begin());
        err.erase(err.begin(), err.end());
        return cmsysProcess_Pipe_STDERR;
      }
      return cmsysProcess_Pipe_None;
    }
  }
}